

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_irStatement * build_ir_dostmt(Context_conflict *ctx,MOJOSHADER_astDoStatement *ast)

{
  int index;
  int iffalse;
  LoopLabels *pLVar1;
  MOJOSHADER_irStatement *pMVar2;
  MOJOSHADER_irStatement *pMVar3;
  MOJOSHADER_irExpression *left;
  MOJOSHADER_irExpression *right;
  MOJOSHADER_irStatement *pMVar4;
  MOJOSHADER_irStatement *next;
  MOJOSHADER_irStatement *retval;
  int join;
  int loop;
  LoopLabels *labels;
  MOJOSHADER_astDoStatement *ast_local;
  Context_conflict *ctx_local;
  
  if (ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL) {
    pLVar1 = push_ir_loop(ctx,0);
    if (pLVar1 == (LoopLabels *)0x0) {
      ctx_local = (Context_conflict *)0x0;
    }
    else {
      index = pLVar1->start;
      iffalse = pLVar1->end;
      pMVar2 = new_ir_label(ctx,index);
      pMVar3 = build_ir_stmt(ctx,ast->statement);
      left = build_ir_expr(ctx,ast->expr);
      right = new_ir_constbool(ctx,1);
      pMVar4 = new_ir_cjump(ctx,MOJOSHADER_IR_COND_EQL,left,right,index,iffalse);
      next = new_ir_label(ctx,iffalse);
      pMVar4 = new_ir_seq(ctx,pMVar4,next);
      pMVar3 = new_ir_seq(ctx,pMVar3,pMVar4);
      pMVar2 = new_ir_seq(ctx,pMVar2,pMVar3);
      pop_ir_loop(ctx);
      pMVar3 = build_ir_stmt(ctx,ast->next);
      ctx_local = (Context_conflict *)new_ir_seq(ctx,pMVar2,pMVar3);
    }
    return (MOJOSHADER_irStatement *)ctx_local;
  }
  __assert_fail("ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0x13d9,
                "MOJOSHADER_irStatement *build_ir_dostmt(Context *, const MOJOSHADER_astDoStatement *)"
               );
}

Assistant:

static MOJOSHADER_irStatement *build_ir_dostmt(Context *ctx,
                                          const MOJOSHADER_astDoStatement *ast)
{
    // !!! FIXME: ast->unroll

    assert(ast->expr->datatype->type == MOJOSHADER_AST_DATATYPE_BOOL);

    /* The gist...
        loop:
            statement
            cjump expr == true, loop, join
        join:
    */

    const LoopLabels *labels = push_ir_loop(ctx, 0);
    if (labels == NULL)
        return NULL;  // out of memory...

    const int loop = labels->start;
    const int join = labels->end;

    MOJOSHADER_irStatement *retval =
        new_ir_seq(ctx, new_ir_label(ctx, loop),
        new_ir_seq(ctx, build_ir_stmt(ctx, ast->statement),
        new_ir_seq(ctx, new_ir_cjump(ctx, MOJOSHADER_IR_COND_EQL, build_ir_expr(ctx, ast->expr), new_ir_constbool(ctx, 1), loop, join),
                        new_ir_label(ctx, join))));

    pop_ir_loop(ctx);

    return new_ir_seq(ctx, retval, build_ir_stmt(ctx, ast->next));
}